

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool write_pidfile(char *pidfile)

{
  uint uVar1;
  FILE *__stream;
  FILE *f;
  char *pidfile_local;
  
  if (pidfile == (char *)0x0) {
    pidfile_local._7_1_ = false;
  }
  else {
    __stream = fopen(pidfile,"w");
    if (__stream == (FILE *)0x0) {
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",0x114
                 ,"write_pidfile",0,4,"Unable to open pidfile for write: %s",pidfile);
      pidfile_local._7_1_ = false;
    }
    else {
      uVar1 = getpid();
      fprintf(__stream,"%d\n",(ulong)uVar1);
      fclose(__stream);
      pidfile_local._7_1_ = true;
    }
  }
  return pidfile_local._7_1_;
}

Assistant:

static bool write_pidfile(const char * pidfile)
{
    FILE * f;
    if (pidfile) {
        f = fopen(pidfile, "w");
        if (!f) {
            log_error(LOG_WARNING, "Unable to open pidfile for write: %s", pidfile);
            return false;
        }
        fprintf(f, "%d\n", getpid());
        fclose(f);
        return true;
    }
    return false;
}